

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

QString * __thiscall
QFileSystemModelPrivate::size
          (QString *__return_storage_ptr__,QFileSystemModelPrivate *this,QModelIndex *index)

{
  bool bVar1;
  QFileSystemNode *this_00;
  qint64 bytes;
  
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    this_00 = node(this,index);
    bVar1 = QFileSystemNode::isDir(this_00);
    if (bVar1) {
      QString::QString(__return_storage_ptr__,(QLatin1StringView)(ZEXT816(0x5c6f59) << 0x40));
    }
    else {
      bytes = QFileSystemNode::size(this_00);
      size(__return_storage_ptr__,bytes);
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileSystemModelPrivate::size(const QModelIndex &index) const
{
    if (!index.isValid())
        return QString();
    const QFileSystemNode *n = node(index);
    if (n->isDir()) {
#ifdef Q_OS_MAC
        return "--"_L1;
#else
        return ""_L1;
#endif
    // Windows   - ""
    // OS X      - "--"
    // Konqueror - "4 KB"
    // Nautilus  - "9 items" (the number of children)
    }
    return size(n->size());
}